

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

int aura_core_call(aura_node *node,aura_object *o,aura_buffer **retbuf,aura_buffer *argbuf)

{
  int iVar1;
  aura_eventloop *loop;
  
  loop = (aura_eventloop *)aura_node_eventloop_get_autocreate(node);
  if (node->sync_call_running != true) {
    node->sync_call_running = true;
    iVar1 = aura_core_start_call
                      (node,o,(_func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *)0x0,
                       (void *)0x0,argbuf);
    if (iVar1 == 0) {
      while (o->pending != 0) {
        aura_eventloop_dispatch(loop,2);
      }
      slog(4,4,"Call completed");
      *retbuf = node->sync_ret_buf;
    }
    else {
      node->sync_call_result = iVar1;
    }
    node->sync_call_running = false;
    return node->sync_call_result;
  }
  BUG(node,"Internal bug: Synchronos call within a synchronos call");
}

Assistant:

int aura_core_call(
	struct aura_node *	node,
	struct aura_object *	o,
	struct aura_buffer **	retbuf,
	struct aura_buffer *	argbuf)
{
	int ret;
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);

	if (node->sync_call_running)
		BUG(node, "Internal bug: Synchronos call within a synchronos call");

	node->sync_call_running = true;

	if ((ret = aura_core_start_call(node, o, NULL, NULL, argbuf))) {
		node->sync_call_result = ret;
		goto bailout;
	}

	while (o->pending)
		aura_eventloop_dispatch(loop, AURA_EVTLOOP_ONCE);

	slog(4, SLOG_DEBUG, "Call completed");
	*retbuf = node->sync_ret_buf;

bailout:
	node->sync_call_running = false;
	return node->sync_call_result;
}